

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O1

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  custom_getopt_data *pcVar1;
  int check_ambiguity;
  bool bVar2;
  int iVar3;
  option *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  size_t sVar10;
  char **ppcVar11;
  uint *puVar12;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  uint *puVar13;
  uint *extraout_RDX_07;
  uint *extraout_RDX_08;
  uint *extraout_RDX_09;
  uint *extraout_RDX_10;
  uint *extraout_RDX_11;
  uint *extraout_RDX_12;
  char cVar14;
  uint uVar15;
  custom_getopt_data *pcVar16;
  char *pcVar17;
  char **possible_values;
  long lVar18;
  size_t sVar19;
  int iVar20;
  int iVar21;
  option *poVar22;
  ulong uVar23;
  uint __c;
  char *additional_error_00;
  char *pcVar24;
  bool bVar25;
  char *default_value;
  cmdline_parser_arg_type arg_type;
  char *pcVar26;
  undefined8 in_stack_fffffffffffffd00;
  int iVar27;
  int local_2cc;
  option *local_2c0;
  gengetopt_args_info local_168;
  
  additional_error_00 = (char *)(ulong)(uint)argc;
  package_name = *argv;
  iVar27 = params->override;
  iVar8 = params->check_required;
  check_ambiguity = params->check_ambiguity;
  pcVar17 = (char *)argv;
  if (params->initialize != 0) {
    in_stack_fffffffffffffd00 = 0x12108c;
    cmdline_parser_init(args_info);
  }
  local_168.input_file_group_counter = 0;
  local_168.help_given = 0;
  local_168.version_given = 0;
  local_168.input_given = 0;
  local_168.xyz_given = 0;
  local_168.stl_given = 0;
  local_168.msms_given = 0;
  local_168.output_given = 0;
  local_168.model_given = 0;
  local_168.beadSize_given = 0;
  local_168.elements_given = 0;
  local_168.viscosity_given = 0;
  local_168.temperature_given = 0;
  local_168.input_arg = (char *)0x0;
  local_168.input_orig = (char *)0x0;
  local_168.xyz_arg = (char *)0x0;
  local_168.xyz_orig = (char *)0x0;
  local_168.stl_arg = (char *)0x0;
  local_168.stl_orig = (char *)0x0;
  local_168.msms_arg = (char *)0x0;
  local_168.msms_orig = (char *)0x0;
  local_168.output_arg = (char *)0x0;
  local_168.output_orig = (char *)0x0;
  local_168.model_arg = model__NULL;
  local_168.model_orig = (char *)0x0;
  local_168.beadSize_arg = 0.2;
  local_168.beadSize_orig = (char *)0x0;
  local_168.elements_flag = 0;
  local_168.viscosity_arg = 0.01;
  local_168.viscosity_orig = (char *)0x0;
  local_168.temperature_arg = 300.0;
  local_168.temperature_orig = (char *)0x0;
  local_168.help_help = gengetopt_args_info_help[0];
  local_168.version_help = gengetopt_args_info_help[1];
  local_168.input_help = gengetopt_args_info_help[3];
  local_168.xyz_help = gengetopt_args_info_help[4];
  local_168.stl_help = gengetopt_args_info_help[5];
  local_168.msms_help = gengetopt_args_info_help[6];
  local_168.output_help = gengetopt_args_info_help[7];
  local_168.model_help = gengetopt_args_info_help[8];
  local_168.beadSize_help = gengetopt_args_info_help[9];
  local_168.elements_help = gengetopt_args_info_help[10];
  local_168.viscosity_help = gengetopt_args_info_help[0xb];
  local_168.temperature_help = gengetopt_args_info_help[0xc];
  local_168.inputs = (char **)0x0;
  local_168.inputs_num = 0;
  uVar15 = params->print_errors;
  pcVar16 = (custom_getopt_data *)0x0;
  iVar20 = 0;
  puVar12 = &args_info->input_given;
  pcVar24 = additional_error_00;
  do {
    iVar21 = (int)additional_error_00;
    custom_opterr = uVar15;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar20;
    if (iVar21 < 1) {
      iVar21 = -1;
LAB_00121845:
      local_2cc = 0;
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
      if ((iVar20 == 0) || ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (iVar20 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      }
      custom_optarg = (char *)pcVar16;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (custom_getopt_data *)0x0) ||
         (*(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind == '\0')) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        bVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
        puVar12 = (uint *)CONCAT71((int7)((ulong)puVar12 >> 8),bVar25);
        pcVar17 = (char *)CONCAT71((int7)((ulong)pcVar17 >> 8),
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 || bVar25);
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 || bVar25) {
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
        }
        else {
          in_stack_fffffffffffffd00 = 0x1214b6;
          exchange(argv,(custom_getopt_data *)pcVar17);
          puVar12 = extraout_RDX;
        }
        iVar20 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < iVar21) {
          ppcVar11 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          do {
            if ((**ppcVar11 == '-') &&
               (iVar20 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0,
               (*ppcVar11)[1] != '\0')) break;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            ppcVar11 = ppcVar11 + 1;
            iVar20 = iVar21;
          } while (iVar21 != _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0);
        }
        iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        iVar3 = iVar20;
        if (iVar20 != iVar21) {
          pcVar17 = "--";
          in_stack_fffffffffffffd00 = 0x121512;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar20;
          iVar5 = strcmp(argv[iVar20],"--");
          puVar12 = extraout_RDX_00;
          iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
          if ((iVar5 == 0) &&
             (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar20 + 1, iVar7 = iVar21,
             iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, iVar3 = iVar21,
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != iVar20)) {
            in_stack_fffffffffffffd00 = 0x121539;
            exchange(argv,(custom_getopt_data *)pcVar17);
            puVar12 = extraout_RDX_01;
            iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar3;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar6;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == iVar21) {
          iVar21 = -1;
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
LAB_001215b9:
          bVar25 = false;
        }
        else {
          pcVar16 = (custom_getopt_data *)argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0]
          ;
          if (*(char *)&pcVar16->custom_optind != '-') {
LAB_001215a4:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            iVar21 = 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar16;
            goto LAB_001215b9;
          }
          cVar14 = *(char *)((long)&pcVar16->custom_optind + 1);
          puVar12 = (uint *)CONCAT71((int7)((ulong)puVar12 >> 8),cVar14);
          if (cVar14 == '\0') goto LAB_001215a4;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar16->custom_optind + (ulong)(cVar14 == '-') + 1);
          iVar21 = 0;
          bVar25 = true;
        }
        local_2cc = 0;
        if (bVar25) goto LAB_001215c8;
      }
      else {
LAB_001215c8:
        additional_error_00 = pcVar24;
        pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        iVar20 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        lVar18 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar26 = argv[lVar18];
        if (pcVar26[1] == '-') {
          for (sVar19 = 0;
              (cVar14 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                         custom_optind + sVar19), cVar14 != '\0' && (cVar14 != '='))
              ; sVar19 = sVar19 + 1) {
          }
          local_2cc = -1;
          iVar21 = 0;
          bVar25 = true;
          pcVar24 = "help";
          bVar2 = false;
          local_2c0 = (option *)0x0;
          poVar22 = cmdline_parser_internal::long_options;
          do {
            in_stack_fffffffffffffd00 = 0x1216af;
            pcVar17 = (char *)pcVar16;
            iVar6 = strncmp(pcVar24,(char *)pcVar16,sVar19);
            iVar7 = local_2cc;
            poVar4 = local_2c0;
            if (iVar6 == 0) {
              in_stack_fffffffffffffd00 = 0x1216bb;
              sVar10 = strlen(pcVar24);
              iVar7 = iVar21;
              poVar4 = poVar22;
              if ((int)sVar10 == (int)sVar19) break;
              if ((local_2c0 != (option *)0x0) &&
                 (((local_2c0->has_arg != poVar22->has_arg || (local_2c0->flag != poVar22->flag)) ||
                  (iVar7 = local_2cc, poVar4 = local_2c0, local_2c0->val != poVar22->val)))) {
                bVar2 = true;
                iVar7 = local_2cc;
                poVar4 = local_2c0;
              }
            }
            local_2c0 = poVar4;
            local_2cc = iVar7;
            iVar21 = iVar21 + 1;
            pcVar24 = poVar22[1].name;
            poVar22 = poVar22 + 1;
            bVar25 = pcVar24 != (char *)0x0;
            iVar7 = local_2cc;
            poVar4 = local_2c0;
          } while (bVar25);
          local_2c0 = poVar4;
          local_2cc = iVar7;
          if ((bool)(!bVar2 | bVar25)) {
            puVar12 = (uint *)(ulong)uVar15;
            pcVar24 = additional_error_00;
            if (local_2c0 == (option *)0x0) {
              if (uVar15 != 0) {
                pcVar17 = "%s: unrecognized option `--%s\'\n";
                in_stack_fffffffffffffd00 = 0x121e02;
                fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar16);
                puVar12 = extraout_RDX_11;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x207f5a;
              iVar21 = 0x3f;
              goto LAB_00121845;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar20 + 1;
            if (*(char *)((long)&pcVar16->custom_optind + sVar19) == '\0') {
              if (local_2c0->has_arg == 1) {
                if ((int)additional_error_00 <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0
                   ) {
                  if (uVar15 != 0) {
                    pcVar24 = *argv;
                    pcVar17 = "%s: option `%s\' requires an argument\n";
                    goto LAB_00121e3b;
                  }
                  goto LAB_00121dad;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar20 + 2;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[lVar18 + 1];
              }
            }
            else {
              if (local_2c0->has_arg == 0) {
                if (uVar15 != 0) {
                  pcVar24 = *argv;
                  if (pcVar26[1] == '-') {
                    pcVar26 = local_2c0->name;
                    pcVar17 = "%s: option `--%s\' doesn\'t allow an argument\n";
LAB_00121e3b:
                    fprintf(_stderr,pcVar17,pcVar24,pcVar26);
                  }
                  else {
                    pcVar17 = "%s: option `%c%s\' doesn\'t allow an argument\n";
                    fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",pcVar24,
                            (ulong)(uint)(int)*pcVar26,local_2c0->name);
                  }
                }
LAB_00121dad:
                pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                in_stack_fffffffffffffd00 = 0x121dbc;
                sVar19 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
                puVar12 = extraout_RDX_10;
                goto LAB_001217cd;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar19 + 1);
            }
            in_stack_fffffffffffffd00 = 0x121c27;
            sVar19 = strlen((char *)pcVar16);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                 (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar19);
            iVar21 = local_2c0->val;
            puVar12 = extraout_RDX_06;
            if (local_2c0->flag != (int *)0x0) {
              *local_2c0->flag = iVar21;
              iVar21 = 0;
            }
            goto LAB_00121847;
          }
          if (uVar15 != 0) {
            pcVar17 = "%s: option `%s\' is ambiguous\n";
            fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar26);
          }
          pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          in_stack_fffffffffffffd00 = 0x1217c7;
          sVar19 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          puVar12 = extraout_RDX_03;
LAB_001217cd:
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar19);
        }
        else {
          pcVar1 = (custom_getopt_data *)
                   ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1);
          cVar14 = *(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
          __c = (uint)cVar14;
          pcVar17 = (char *)(ulong)__c;
          in_stack_fffffffffffffd00 = 0x12162a;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar1;
          pvVar9 = memchr("hVi:x:o:s:ev:t:",__c,0x10);
          if (*(char *)((long)&pcVar16->custom_optind + 1) == '\0') {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar20 + 1;
          }
          puVar12 = (uint *)CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),
                                     cVar14 == ':' || pvVar9 == (void *)0x0);
          if (cVar14 != ':' && pvVar9 != (void *)0x0) {
            if (*(char *)((long)pvVar9 + 1) == ':') {
              if (*(char *)((long)pvVar9 + 2) == ':') {
                if (*(char *)&pcVar1->custom_optind == '\0') {
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
                }
                else {
LAB_00121820:
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                       _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar1;
                }
              }
              else {
                if (*(char *)&pcVar1->custom_optind != '\0') goto LAB_00121820;
                lVar18 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
                if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == (int)additional_error_00
                   ) {
                  cVar14 = '?';
                  if (uVar15 != 0) {
                    pcVar17 = "%s: option requires an argument -- %c\n";
                    in_stack_fffffffffffffd00 = 0x121d52;
                    fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)__c);
                    puVar12 = extraout_RDX_08;
                  }
                }
                else {
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                       _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                       (custom_getopt_data *)argv[lVar18];
                }
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
            }
            iVar21 = (int)cVar14;
            pcVar24 = additional_error_00;
            goto LAB_00121845;
          }
          if (uVar15 != 0) {
            pcVar17 = "%s: invalid option -- %c\n";
            in_stack_fffffffffffffd00 = 0x121d7a;
            fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)__c);
            puVar12 = extraout_RDX_09;
          }
        }
        local_2cc = 0;
        iVar21 = 0x3f;
        pcVar24 = additional_error_00;
      }
    }
LAB_00121847:
    pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar20 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    uVar15 = custom_opterr;
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    if (iVar21 < 0x56) {
      if (iVar21 != -1) {
        if (iVar21 != 0) {
          if (iVar21 != 0x3f) break;
          iVar21 = 5;
          goto LAB_00121b86;
        }
        pcVar26 = cmdline_parser_internal::long_options[local_2cc].name;
        in_stack_fffffffffffffd00 = 0x12190b;
        iVar21 = strcmp(pcVar26,"stl");
        if (iVar21 == 0) {
          additional_error_00 = pcVar24;
          if (args_info->input_file_group_counter != 0 && iVar27 != 0) {
            in_stack_fffffffffffffd00 = 0x121bb5;
            reset_group_input_file(args_info);
            additional_error_00 = pcVar24;
          }
          args_info->input_file_group_counter = args_info->input_file_group_counter + 1;
          iVar21 = 0x1fc1d4;
          puVar12 = &local_168.stl_given;
          puVar13 = &args_info->stl_given;
          pcVar17 = (char *)&args_info->stl_orig;
          ppcVar11 = &args_info->stl_arg;
LAB_00121ca9:
          iVar7 = update_arg(ppcVar11,(char **)pcVar17,puVar13,puVar12,(char *)pcVar16,(char **)0x0,
                             (char *)0x0,ARG_STRING,check_ambiguity,iVar27,0,iVar21,(char *)0x2d,
                             (char)in_stack_fffffffffffffd00,additional_error_00);
          iVar21 = 5;
          puVar12 = extraout_RDX_07;
          pcVar24 = additional_error_00;
          if (iVar7 != 0) goto LAB_00121b86;
        }
        else {
          in_stack_fffffffffffffd00 = 0x121922;
          iVar21 = strcmp(pcVar26,"msms");
          if (iVar21 == 0) {
            if (args_info->input_file_group_counter != 0 && iVar27 != 0) {
              in_stack_fffffffffffffd00 = 0x121c6f;
              reset_group_input_file(args_info);
            }
            args_info->input_file_group_counter = args_info->input_file_group_counter + 1;
            iVar21 = 0x1fd01e;
            puVar12 = &local_168.msms_given;
            puVar13 = &args_info->msms_given;
            pcVar17 = (char *)&args_info->msms_orig;
            ppcVar11 = &args_info->msms_arg;
            additional_error_00 = pcVar24;
            goto LAB_00121ca9;
          }
          pcVar17 = "model";
          in_stack_fffffffffffffd00 = 0x121939;
          additional_error_00 = pcVar24;
          iVar21 = strcmp(pcVar26,"model");
          puVar12 = extraout_RDX_04;
          pcVar24 = additional_error_00;
          if (iVar21 == 0) {
            possible_values = cmdline_parser_model_values;
            pcVar26 = (char *)0x2d;
            iVar21 = 0x1fcc3b;
            iVar7 = 0;
            arg_type = ARG_ENUM;
            puVar12 = &local_168.model_given;
            puVar13 = &args_info->model_given;
            pcVar17 = (char *)&args_info->model_orig;
            ppcVar11 = (char **)&args_info->model_arg;
            goto LAB_00121b26;
          }
        }
        goto LAB_00121b84;
      }
      iVar21 = 3;
      goto LAB_00121b86;
    }
    switch(iVar21) {
    case 0x65:
      pcVar17 = (char *)0x0;
      possible_values = (char **)0x0;
      pcVar26 = (char *)0x65;
      iVar21 = 0x1fd033;
      iVar7 = 1;
      arg_type = ARG_FLAG;
      puVar12 = &local_168.elements_given;
      puVar13 = &args_info->elements_given;
      ppcVar11 = (char **)&args_info->elements_flag;
      goto LAB_00121b26;
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x77:
      goto switchD_00121884_caseD_66;
    case 0x68:
      goto switchD_00121884_caseD_68;
    case 0x69:
      if (args_info->input_file_group_counter != 0 && iVar27 != 0) {
        in_stack_fffffffffffffd00 = 0x1219fa;
        reset_group_input_file(args_info);
      }
      args_info->input_file_group_counter = args_info->input_file_group_counter + 1;
      pcVar26 = (char *)0x69;
      iVar21 = 0x1fd018;
      puVar12 = &local_168.input_given;
      puVar13 = &args_info->input_given;
      pcVar17 = (char *)&args_info->input_orig;
      ppcVar11 = &args_info->input_arg;
      break;
    case 0x6f:
      pcVar26 = (char *)0x6f;
      iVar21 = 0x1fd023;
      puVar12 = &local_168.output_given;
      puVar13 = &args_info->output_given;
      pcVar17 = (char *)&args_info->output_orig;
      ppcVar11 = &args_info->output_arg;
      break;
    case 0x73:
      pcVar26 = (char *)0x73;
      iVar21 = 0x1fd02a;
      default_value = "0.2";
      puVar12 = &local_168.beadSize_given;
      puVar13 = &args_info->beadSize_given;
      pcVar17 = (char *)&args_info->beadSize_orig;
      ppcVar11 = (char **)&args_info->beadSize_arg;
      goto LAB_00121b71;
    case 0x74:
      pcVar26 = (char *)0x74;
      iVar21 = 0x1fd046;
      default_value = "300";
      puVar12 = &local_168.temperature_given;
      puVar13 = &args_info->temperature_given;
      pcVar17 = (char *)&args_info->temperature_orig;
      ppcVar11 = (char **)&args_info->temperature_arg;
      goto LAB_00121b71;
    case 0x76:
      pcVar26 = (char *)0x76;
      iVar21 = 0x1fd03c;
      default_value = "0.01";
      puVar12 = &local_168.viscosity_given;
      puVar13 = &args_info->viscosity_given;
      pcVar17 = (char *)&args_info->viscosity_orig;
      ppcVar11 = (char **)&args_info->viscosity_arg;
LAB_00121b71:
      iVar7 = 0;
      arg_type = ARG_DOUBLE;
      possible_values = (char **)0x0;
      goto LAB_00121b72;
    case 0x78:
      if (args_info->input_file_group_counter != 0 && iVar27 != 0) {
        in_stack_fffffffffffffd00 = 0x121adf;
        reset_group_input_file(args_info);
      }
      args_info->input_file_group_counter = args_info->input_file_group_counter + 1;
      pcVar26 = (char *)0x78;
      iVar21 = 0x1fc1d9;
      puVar12 = &local_168.xyz_given;
      puVar13 = &args_info->xyz_given;
      pcVar17 = (char *)&args_info->xyz_orig;
      ppcVar11 = &args_info->xyz_arg;
      break;
    default:
      if (iVar21 == 0x56) {
        cmdline_parser_print_version();
        goto LAB_00121f67;
      }
      goto switchD_00121884_caseD_66;
    }
    possible_values = (char **)0x0;
    iVar7 = 0;
    arg_type = ARG_STRING;
LAB_00121b26:
    default_value = (char *)0x0;
LAB_00121b72:
    iVar7 = update_arg(ppcVar11,(char **)pcVar17,puVar13,puVar12,(char *)pcVar16,possible_values,
                       default_value,arg_type,check_ambiguity,iVar27,iVar7,iVar21,pcVar26,
                       (char)in_stack_fffffffffffffd00,pcVar24);
    iVar21 = 5;
    puVar12 = extraout_RDX_05;
    if (iVar7 == 0) {
LAB_00121b84:
      iVar21 = 0;
    }
LAB_00121b86:
    if (iVar21 != 0) {
      if (iVar21 == 5) {
        cmdline_parser_release(&local_168);
        iVar8 = 1;
      }
      else {
        uVar15 = args_info->input_file_group_counter;
        if (1 < (int)uVar15) {
          fprintf(_stderr,"%s: %d options of group input file were given. One is required%s.\n",
                  *argv,(ulong)uVar15,"");
          puVar12 = extraout_RDX_12;
        }
        iVar27 = (int)pcVar24;
        uVar15 = (uint)(1 < (int)uVar15);
        if (iVar8 != 0) {
          iVar8 = cmdline_parser_required2(args_info,*argv,(char *)puVar12);
          uVar15 = uVar15 + iVar8;
        }
        cmdline_parser_release(&local_168);
        iVar8 = 1;
        if (uVar15 == 0) {
          iVar8 = 0;
          uVar15 = iVar27 - iVar20;
          if (uVar15 != 0 && iVar20 <= iVar27) {
            args_info->inputs_num = uVar15;
            ppcVar11 = (char **)malloc((ulong)uVar15 * 8);
            args_info->inputs = ppcVar11;
            iVar8 = 0;
            uVar23 = 0;
            do {
              pcVar17 = gengetopt_strdup(argv[(long)iVar20 + uVar23]);
              args_info->inputs[uVar23] = pcVar17;
              uVar23 = uVar23 + 1;
            } while (uVar15 != uVar23);
          }
        }
      }
      return iVar8;
    }
  } while( true );
switchD_00121884_caseD_66:
  cmdline_parser_internal();
switchD_00121884_caseD_68:
  cmdline_parser_print_help();
LAB_00121f67:
  cmdline_parser_free(&local_168);
  exit(0);
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "xyz",	1, NULL, 'x' },
        { "stl",	1, NULL, 0 },
        { "msms",	1, NULL, 0 },
        { "output",	1, NULL, 'o' },
        { "model",	1, NULL, 0 },
        { "beadSize",	1, NULL, 's' },
        { "elements",	0, NULL, 'e' },
        { "viscosity",	1, NULL, 'v' },
        { "temperature",	1, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:x:o:s:ev:t:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input MetaData (omd) file.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* xyz file for AtomicBead model.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->xyz_arg), 
               &(args_info->xyz_orig), &(args_info->xyz_given),
              &(local_args_info.xyz_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "xyz", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file prefix.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 's':	/* bead size (diameter) for RoughShell model (in angstroms).  */
        
        
          if (update_arg( (void *)&(args_info->beadSize_arg), 
               &(args_info->beadSize_orig), &(args_info->beadSize_given),
              &(local_args_info.beadSize_given), optarg, 0, "0.2", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "beadSize", 's',
              additional_error))
            goto failure;
        
          break;
        case 'e':	/* output the hydrodynamic elements (beads or triangles) only, hydrodynamics calculation will not be performed.  */
        
        
          if (update_arg((void *)&(args_info->elements_flag), 0, &(args_info->elements_given),
              &(local_args_info.elements_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "elements", 'e',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* viscosity (in poise).  */
        
        
          if (update_arg( (void *)&(args_info->viscosity_arg), 
               &(args_info->viscosity_orig), &(args_info->viscosity_given),
              &(local_args_info.viscosity_given), optarg, 0, "0.01", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "viscosity", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* temperature (in Kelvin.  */
        
        
          if (update_arg( (void *)&(args_info->temperature_arg), 
               &(args_info->temperature_orig), &(args_info->temperature_given),
              &(local_args_info.temperature_given), optarg, 0, "300", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "temperature", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* stl file for BoundaryElement model.  */
          if (strcmp (long_options[option_index].name, "stl") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->stl_arg), 
                 &(args_info->stl_orig), &(args_info->stl_given),
                &(local_args_info.stl_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "stl", '-',
                additional_error))
              goto failure;
          
          }
          /* filename root for MSMS .vert and .face files.  */
          else if (strcmp (long_options[option_index].name, "msms") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->msms_arg), 
                 &(args_info->msms_orig), &(args_info->msms_given),
                &(local_args_info.msms_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "msms", '-',
                additional_error))
              goto failure;
          
          }
          /* hydrodynamics model.  */
          else if (strcmp (long_options[option_index].name, "model") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->model_arg), 
                 &(args_info->model_orig), &(args_info->model_given),
                &(local_args_info.model_given), optarg, cmdline_parser_model_values, 0, ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "model", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->input_file_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group input file were given. One is required%s.\n", argv[0], args_info->input_file_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}